

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  size_t sVar4;
  undefined4 uVar8;
  Layer *pLVar5;
  size_t sVar6;
  void *pvVar7;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  pointer piVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  float *sptr;
  uint uVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  ulong uVar22;
  int iVar23;
  size_t totalsize;
  ulong uVar24;
  int iVar25;
  size_type __n;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  void *pvVar31;
  char *pcVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  bool bVar36;
  float fVar37;
  void *local_230;
  long local_220;
  Mat bottom_blob_int8;
  char *local_1c0;
  void *local_1b8;
  ulong local_1a8;
  long local_198;
  Mat bottom_blob_g;
  Mat bottom_blob_int8_g;
  undefined1 local_d8 [36];
  undefined8 uStack_b4;
  int iStack_ac;
  size_t local_a8;
  void *local_98;
  void *local_90;
  long local_88;
  void *local_80;
  void *local_78;
  char *weight_data_ptr;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g_1;
  
  iVar26 = bottom_blob->c;
  if (iVar26 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar28 = bottom_blob->w;
  iVar25 = bottom_blob->h;
  sVar4 = bottom_blob->elemsize;
  uVar18 = (this->kernel_w + -1) * this->dilation_w;
  uVar14 = (this->kernel_h + -1) * this->dilation_h;
  local_d8._0_8_ = bottom_blob->data;
  local_d8._8_8_ = bottom_blob->refcount;
  local_d8._24_8_ = bottom_blob->allocator;
  local_d8._32_4_ = bottom_blob->dims;
  if ((int *)local_d8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + 1;
    UNLOCK();
  }
  uVar3 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  uStack_b4._4_4_ = uVar8;
  uStack_b4._0_4_ = uVar3;
  iStack_ac = bottom_blob->c;
  local_a8 = bottom_blob->cstep;
  local_d8._16_8_ = sVar4;
  if ((sVar4 != 1 & this->use_int8_inference) == 1) {
    bottom_blob_int8.allocator = opt->workspace_allocator;
    auVar12._4_4_ = -(uint)(iVar25 == 0);
    auVar12._0_4_ = -(uint)(iVar28 == 0);
    auVar12._8_4_ = -(uint)(iVar26 == 0);
    auVar12._12_4_ = 0;
    movmskps((int)&bottom_blob_int8.dims,auVar12 << 0x20);
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.elemsize = 1;
    bottom_blob_int8.w = iVar28;
    bottom_blob_int8.dims = 3;
    bottom_blob_int8.h = iVar25;
    bottom_blob_int8.c = iVar26;
    bottom_blob_int8.cstep = (long)(iVar25 * iVar28) + 0xfU & 0xfffffffffffffff0;
    uVar24 = bottom_blob_int8.cstep * (long)iVar26;
    if (uVar24 != 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        pvVar31 = malloc(uVar24 + 0x1c);
        bottom_blob_int8.data = (void *)((long)pvVar31 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)bottom_blob_int8.data - 8) = pvVar31;
      }
      else {
        bottom_blob_int8.data =
             (void *)(*(code *)**(undefined8 **)bottom_blob_int8.allocator)
                               (bottom_blob_int8.allocator,uVar24 | 4);
      }
      bottom_blob_int8.refcount = (int *)((long)bottom_blob_int8.data + uVar24);
      *(undefined4 *)((long)bottom_blob_int8.data + uVar24) = 1;
    }
    if (bottom_blob_int8.data == (void *)0x0) {
      bVar36 = true;
    }
    else {
      bVar36 = (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    }
    if (bVar36) {
      if (bottom_blob_int8.refcount != (int *)0x0) {
        LOCK();
        *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
        UNLOCK();
        if (*bottom_blob_int8.refcount == 0) {
          if (bottom_blob_int8.allocator == (Allocator *)0x0) {
            if (bottom_blob_int8.data != (void *)0x0) {
              free(*(void **)((long)bottom_blob_int8.data + -8));
            }
          }
          else {
            (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
          }
        }
      }
      bottom_blob_int8.data = (void *)0x0;
      bottom_blob_int8.refcount = (int *)0x0;
      bottom_blob_int8.dims = 0;
      bottom_blob_int8.w = 0;
      bottom_blob_int8.h = 0;
      bottom_blob_int8.c = 0;
      iVar15 = -100;
      goto LAB_00138e76;
    }
    iVar15 = iVar26 / this->group;
    if (0 < this->group) {
      lVar33 = 0;
      lVar34 = 0;
      do {
        uVar9._0_1_ = opt->lightmode;
        uVar9._1_3_ = *(undefined3 *)&opt->field_0x1;
        uVar9._4_4_ = opt->num_threads;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)opt->workspace_allocator;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(1,(int)uVar9);
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)bottom_blob_int8.allocator;
        bottom_blob_g.elemsize = bottom_blob->elemsize;
        bottom_blob_g.allocator = bottom_blob->allocator;
        bottom_blob_g.refcount = (int *)0x0;
        bottom_blob_g.data =
             (void *)(bottom_blob->cstep * lVar33 * bottom_blob_g.elemsize + (long)bottom_blob->data
                     );
        bottom_blob_g.w = bottom_blob->w;
        bottom_blob_g.dims = 3;
        bottom_blob_g.h = bottom_blob->h;
        bottom_blob_g.c = iVar15;
        bottom_blob_g.cstep =
             ((long)(bottom_blob->h * bottom_blob->w) * bottom_blob_g.elemsize + 0xf &
             0xfffffffffffffff0) / bottom_blob_g.elemsize;
        bottom_blob_int8_g.refcount = (int *)0x0;
        bottom_blob_int8_g.data =
             (void *)(bottom_blob_int8.cstep * lVar33 * bottom_blob_int8.elemsize +
                     (long)bottom_blob_int8.data);
        bottom_blob_int8_g.elemsize = bottom_blob_int8.elemsize;
        bottom_blob_int8_g.allocator = bottom_blob_int8.allocator;
        bottom_blob_int8_g.w = bottom_blob_int8.w;
        bottom_blob_int8_g.dims = 3;
        bottom_blob_int8_g.h = bottom_blob_int8.h;
        bottom_blob_int8_g.c = iVar15;
        bottom_blob_int8_g.cstep =
             ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * bottom_blob_int8.elemsize + 0xf &
             0xfffffffffffffff0) / bottom_blob_int8.elemsize;
        pLVar5 = (this->quantize_ops).
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar34];
        (*pLVar5->_vptr_Layer[5])(pLVar5,&bottom_blob_g,&bottom_blob_int8_g,&_space_ofs);
        if (bottom_blob_int8_g.refcount != (int *)0x0) {
          LOCK();
          *bottom_blob_int8_g.refcount = *bottom_blob_int8_g.refcount + -1;
          UNLOCK();
          if (*bottom_blob_int8_g.refcount == 0) {
            if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
              if (bottom_blob_int8_g.data != (void *)0x0) {
                free(*(void **)((long)bottom_blob_int8_g.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)bottom_blob_int8_g.allocator + 8))();
            }
          }
        }
        bottom_blob_int8_g.data = (void *)0x0;
        bottom_blob_int8_g.refcount = (int *)0x0;
        bottom_blob_int8_g.elemsize = 0;
        bottom_blob_int8_g.cstep = 0;
        bottom_blob_int8_g.dims = 0;
        bottom_blob_int8_g.w = 0;
        bottom_blob_int8_g.h = 0;
        bottom_blob_int8_g.c = 0;
        if (bottom_blob_g.refcount != (int *)0x0) {
          LOCK();
          *bottom_blob_g.refcount = *bottom_blob_g.refcount + -1;
          UNLOCK();
          if (*bottom_blob_g.refcount == 0) {
            if (bottom_blob_g.allocator == (Allocator *)0x0) {
              if (bottom_blob_g.data != (void *)0x0) {
                free(*(void **)((long)bottom_blob_g.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)bottom_blob_g.allocator + 8))();
            }
          }
        }
        bottom_blob_g.data = (void *)0x0;
        bottom_blob_g.refcount = (int *)0x0;
        bottom_blob_g.elemsize = 0;
        bottom_blob_g.cstep = 0;
        bottom_blob_g.dims = 0;
        bottom_blob_g.w = 0;
        bottom_blob_g.h = 0;
        bottom_blob_g.c = 0;
        lVar34 = lVar34 + 1;
        lVar33 = lVar33 + iVar15;
      } while (lVar34 < this->group);
    }
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + 1;
      UNLOCK();
    }
    if ((int *)local_d8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_d8._8_8_ == 0) {
        if ((Allocator *)local_d8._24_8_ == (Allocator *)0x0) {
          if ((void *)local_d8._0_8_ != (void *)0x0) {
            free(*(void **)(local_d8._0_8_ + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_d8._24_8_ + 8))();
        }
      }
    }
    local_d8._0_8_ = bottom_blob_int8.data;
    local_d8._8_8_ = bottom_blob_int8.refcount;
    local_d8._16_8_ = bottom_blob_int8.elemsize;
    local_d8._24_8_ = bottom_blob_int8.allocator;
    local_d8._32_4_ = bottom_blob_int8.dims;
    uStack_b4._0_4_ = bottom_blob_int8.w;
    uStack_b4._4_4_ = bottom_blob_int8.h;
    iStack_ac = bottom_blob_int8.c;
    local_a8 = bottom_blob_int8.cstep;
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
      UNLOCK();
      if (*bottom_blob_int8.refcount == 0) {
        if (bottom_blob_int8.allocator == (Allocator *)0x0) {
          if (bottom_blob_int8.data != (void *)0x0) {
            free(*(void **)((long)bottom_blob_int8.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
        }
      }
    }
  }
  bottom_blob_int8.refcount = (int *)local_d8._8_8_;
  bottom_blob_int8.data = (void *)local_d8._0_8_;
  bottom_blob_int8.elemsize = local_d8._16_8_;
  bottom_blob_int8.allocator = (Allocator *)local_d8._24_8_;
  if ((int *)local_d8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + 1;
    UNLOCK();
  }
  bottom_blob_int8.dims = local_d8._32_4_;
  bottom_blob_int8.w = (undefined4)uStack_b4;
  bottom_blob_int8.h = uStack_b4._4_4_;
  bottom_blob_int8.c = iStack_ac;
  bottom_blob_int8.cstep = local_a8;
  iVar15 = this->pad_w;
  if ((iVar15 < 1) && (this->pad_h < 1)) {
    if (this->pad_h == -0xe9 && iVar15 == -0xe9) {
      iVar29 = uVar18 - (iVar28 + -1) % this->stride_w;
      iVar15 = uVar14 - (iVar25 + -1) % this->stride_h;
      if ((iVar29 < 1) && (iVar15 < 1)) {
LAB_0013855c:
        bVar36 = true;
        iVar25 = bottom_blob_int8.h;
        iVar28 = bottom_blob_int8.w;
      }
      else {
        copy_make_border((Mat *)local_d8,&bottom_blob_int8,iVar15 / 2,iVar15 - iVar15 / 2,iVar29 / 2
                         ,iVar29 - iVar29 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        if (bottom_blob_int8.data == (void *)0x0) {
          bVar36 = false;
        }
        else {
          if ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0) goto LAB_0013855c;
          bVar36 = false;
        }
      }
      iVar15 = -100;
      if (!bVar36) goto LAB_00138e29;
    }
LAB_00137ff6:
    iVar29 = (int)(~uVar18 + iVar28) / this->stride_w;
    uVar18 = iVar29 + 1;
    iVar25 = (int)(~uVar14 + iVar25) / this->stride_h;
    Mat::create(top_blob,uVar18,iVar25 + 1U,this->num_output,sVar4,opt->blob_allocator);
    iVar15 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar24 = (ulong)uVar18;
      uVar14 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar14;
      std::vector<int,_std::allocator<int>_>::vector
                (&_space_ofs,__n,(allocator_type *)&bottom_blob_g);
      piVar13 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < this->kernel_h) {
        iVar15 = this->dilation_h;
        iVar1 = this->dilation_w;
        iVar2 = this->kernel_w;
        iVar27 = 0;
        iVar19 = 0;
        iVar23 = 0;
        do {
          if (0 < this->kernel_w) {
            lVar33 = 0;
            do {
              _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar27 + lVar33] = iVar19;
              iVar19 = iVar19 + this->dilation_w;
              lVar33 = lVar33 + 1;
            } while ((int)lVar33 < this->kernel_w);
            iVar27 = iVar27 + (int)lVar33;
          }
          iVar19 = iVar19 + (iVar28 * iVar15 - iVar1 * iVar2);
          iVar23 = iVar23 + 1;
        } while (iVar23 < this->kernel_h);
      }
      iVar28 = this->num_output;
      iVar15 = this->group;
      bVar36 = iVar15 != iVar28 || iVar26 != iVar15;
      if (this->use_int8_inference == false) {
        if (bVar36) {
          uVar16 = iVar26 / iVar15;
          uVar17 = iVar28 / iVar15;
          iVar26 = this->group;
          if (0 < (long)iVar26) {
            local_80 = top_blob->data;
            local_88 = top_blob->cstep * top_blob->elemsize;
            local_98 = (this->weight_data).data;
            weight_data_ptr = (char *)(ulong)uVar17;
            iVar15 = uVar16 * uVar14 * uVar17;
            local_90 = (void *)CONCAT44(local_90._4_4_,iVar15);
            iVar28 = 0;
            local_198 = 0;
            do {
              if (0 < (int)uVar17) {
                local_1b8 = (void *)((long)local_98 + (long)iVar28 * 4);
                local_78 = (void *)(local_198 * (int)uVar17);
                local_1c0 = (char *)0x0;
                do {
                  if (-1 < iVar25) {
                    pvVar31 = (void *)(local_88 * (long)(local_1c0 + (long)local_78) +
                                      (long)local_80);
                    iVar1 = this->bias_term;
                    iVar2 = 0;
                    do {
                      if (-1 < iVar29) {
                        pvVar20 = (this->bias_data).data;
                        iVar19 = this->stride_h;
                        iVar23 = this->stride_w;
                        uVar30 = 0;
                        do {
                          if (iVar1 == 0) {
                            fVar37 = 0.0;
                          }
                          else {
                            fVar37 = *(float *)((long)pvVar20 +
                                               (long)(local_1c0 + (long)local_78) * 4);
                          }
                          if (0 < (int)uVar16) {
                            uVar22 = 0;
                            pvVar21 = local_1b8;
                            do {
                              if (0 < (int)uVar14) {
                                uVar35 = 0;
                                do {
                                  fVar37 = fVar37 + *(float *)((long)pvVar21 + uVar35 * 4) *
                                                    *(float *)((long)bottom_blob_int8.data +
                                                              (long)_space_ofs.
                                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar35] *
                                                  4 + (uVar22 + uVar16 * (int)local_198) *
                                                      bottom_blob_int8.cstep *
                                                      bottom_blob_int8.elemsize +
                                                      uVar30 * (long)iVar23 * 4 +
                                                      (long)(bottom_blob_int8.w * iVar2 * iVar19) *
                                                      4);
                                  uVar35 = uVar35 + 1;
                                } while (uVar14 != uVar35);
                              }
                              uVar22 = uVar22 + 1;
                              pvVar21 = (void *)((long)pvVar21 + __n * 4);
                            } while (uVar22 != uVar16);
                          }
                          *(float *)((long)pvVar31 + uVar30 * 4) = fVar37;
                          uVar30 = uVar30 + 1;
                        } while (uVar30 != uVar24);
                      }
                      pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar18 * 4);
                      bVar36 = iVar2 != iVar25;
                      iVar2 = iVar2 + 1;
                    } while (bVar36);
                  }
                  local_1c0 = local_1c0 + 1;
                  local_1b8 = (void *)((long)local_1b8 + (long)(int)(uVar16 * uVar14) * 4);
                } while (local_1c0 != weight_data_ptr);
              }
              local_198 = local_198 + 1;
              iVar28 = iVar28 + iVar15;
            } while (local_198 != iVar26);
          }
        }
        else {
          iVar26 = this->group;
          if (0 < (long)iVar26) {
            sVar4 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            pvVar31 = top_blob->data;
            pvVar20 = (this->weight_data).data;
            lVar33 = 0;
            do {
              if (-1 < iVar25) {
                pvVar21 = (void *)(sVar4 * sVar6 * lVar33 + (long)pvVar31);
                iVar28 = this->bias_term;
                iVar15 = this->stride_h;
                iVar1 = this->stride_w;
                local_230 = (void *)0x0;
                do {
                  if (-1 < iVar29) {
                    pvVar7 = (this->bias_data).data;
                    uVar30 = 0;
                    do {
                      if (iVar28 == 0) {
                        fVar37 = 0.0;
                      }
                      else {
                        fVar37 = *(float *)((long)pvVar7 + lVar33 * 4);
                      }
                      if (0 < (int)uVar14) {
                        uVar22 = 0;
                        do {
                          fVar37 = fVar37 + *(float *)((long)pvVar20 + uVar22 * 4) *
                                            *(float *)((long)bottom_blob_int8.data +
                                                      (long)_space_ofs.
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22] *
                                                  4 + uVar30 * (long)iVar1 * 4 +
                                                      (long)(iVar15 * bottom_blob_int8.w *
                                                            (int)local_230) * 4 +
                                                      bottom_blob_int8.cstep *
                                                      bottom_blob_int8.elemsize * lVar33);
                          uVar22 = uVar22 + 1;
                        } while (uVar14 != uVar22);
                      }
                      *(float *)((long)pvVar21 + uVar30 * 4) = fVar37;
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar24);
                  }
                  pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar18 * 4);
                  local_230 = (void *)((long)local_230 + 1);
                } while (local_230 != (void *)(ulong)(iVar25 + 1U));
              }
              lVar33 = lVar33 + 1;
              pvVar20 = (void *)((long)pvVar20 + __n * 4);
            } while (lVar33 != iVar26);
          }
        }
      }
      else if (bVar36) {
        uVar16 = iVar26 / iVar15;
        uVar17 = iVar28 / iVar15;
        if (0 < this->group) {
          local_78 = top_blob->data;
          local_80 = (void *)(top_blob->cstep * top_blob->elemsize);
          local_90 = (this->weight_data).data;
          iVar26 = uVar17 * uVar16 * uVar14;
          local_98 = (void *)CONCAT44(local_98._4_4_,iVar26);
          local_88 = (long)(int)(uVar16 * uVar14);
          local_198 = 0;
          do {
            if (0 < (int)uVar17) {
              weight_data_ptr = (char *)((long)(iVar26 * (int)local_198) + (long)local_90);
              local_1a8 = 0;
              do {
                if (-1 < iVar25) {
                  local_230 = (void *)((local_198 * (int)uVar17 + local_1a8) * (long)local_80 +
                                      (long)local_78);
                  iVar28 = 0;
                  do {
                    if (-1 < iVar29) {
                      uVar30 = 0;
                      do {
                        if ((int)uVar16 < 1) {
                          iVar15 = 0;
                        }
                        else {
                          uVar22 = 0;
                          iVar15 = 0;
                          pcVar32 = weight_data_ptr + local_1a8 * local_88;
                          do {
                            if (0 < (int)uVar14) {
                              uVar35 = 0;
                              do {
                                iVar15 = iVar15 + (int)pcVar32[uVar35] *
                                                  (int)*(char *)((long)bottom_blob_int8.data +
                                                                (long)_space_ofs.
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar35] +
                                                  (uVar22 + uVar16 * (int)local_198) *
                                                  bottom_blob_int8.cstep * bottom_blob_int8.elemsize
                                                  + (long)(bottom_blob_int8.w * iVar28 *
                                                          this->stride_h) +
                                                    (long)(int)uVar30 * (long)this->stride_w);
                                uVar35 = uVar35 + 1;
                              } while (uVar14 != uVar35);
                            }
                            pcVar32 = pcVar32 + __n;
                            uVar22 = uVar22 + 1;
                          } while (uVar22 != uVar16);
                        }
                        *(int *)((long)local_230 + uVar30 * 4) = iVar15;
                        uVar30 = uVar30 + 1;
                      } while (uVar30 != uVar24);
                    }
                    local_230 = (void *)((long)local_230 + (long)(int)uVar18 * 4);
                    bVar36 = iVar28 != iVar25;
                    iVar28 = iVar28 + 1;
                  } while (bVar36);
                }
                local_1a8 = local_1a8 + 1;
              } while (local_1a8 != uVar17);
            }
            local_198 = local_198 + 1;
          } while (local_198 < this->group);
        }
        if (0 < this->group) {
          lVar33 = 0;
          lVar34 = 0;
          do {
            uVar11._0_1_ = opt->lightmode;
            uVar11._1_3_ = *(undefined3 *)&opt->field_0x1;
            uVar11._4_4_ = opt->num_threads;
            bottom_blob_int8_g.elemsize = (size_t)opt->workspace_allocator;
            bottom_blob_int8_g.data._0_4_ = (undefined4)uVar11;
            bottom_blob_int8_g.data._4_4_ = 1;
            bottom_blob_g.allocator = top_blob->allocator;
            bottom_blob_int8_g.refcount = (int *)bottom_blob_g.allocator;
            bottom_blob_g.elemsize = top_blob->elemsize;
            bottom_blob_g.refcount = (int *)0x0;
            bottom_blob_g.data =
                 (void *)(top_blob->cstep * lVar33 * bottom_blob_g.elemsize + (long)top_blob->data);
            bottom_blob_g.w = top_blob->w;
            bottom_blob_g.dims = 3;
            bottom_blob_g.h = top_blob->h;
            bottom_blob_g.c = uVar17;
            bottom_blob_g.cstep =
                 ((long)(top_blob->h * top_blob->w) * bottom_blob_g.elemsize + 0xf &
                 0xfffffffffffffff0) / bottom_blob_g.elemsize;
            pLVar5 = (this->dequantize_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar34];
            (*pLVar5->_vptr_Layer[7])(pLVar5,&bottom_blob_g,&bottom_blob_int8_g);
            Mat::~Mat(&bottom_blob_g);
            lVar34 = lVar34 + 1;
            lVar33 = lVar33 + (int)uVar17;
          } while (lVar34 < this->group);
        }
      }
      else if (0 < this->group) {
        local_220 = 0;
        lVar33 = 0;
        do {
          bottom_blob_g.data =
               (void *)(bottom_blob_int8.cstep * lVar33 * bottom_blob_int8.elemsize +
                       (long)bottom_blob_int8.data);
          pvVar31 = (this->weight_data).data;
          bottom_blob_g.refcount = (int *)0x0;
          bottom_blob_g.elemsize = bottom_blob_int8.elemsize;
          bottom_blob_g.allocator = bottom_blob_int8.allocator;
          bottom_blob_g.w = bottom_blob_int8.w;
          bottom_blob_g.dims = 2;
          bottom_blob_g.h = bottom_blob_int8.h;
          bottom_blob_g.c = 1;
          bottom_blob_g.cstep = (size_t)(bottom_blob_int8.h * bottom_blob_int8.w);
          if (-1 < iVar25) {
            pvVar20 = (void *)((long)top_blob->data + top_blob->cstep * lVar33 * top_blob->elemsize)
            ;
            iVar26 = 0;
            do {
              if (-1 < iVar29) {
                uVar24 = 0;
                do {
                  if ((int)uVar14 < 1) {
                    iVar28 = 0;
                  }
                  else {
                    uVar30 = 0;
                    iVar28 = 0;
                    do {
                      iVar28 = iVar28 + (int)*(char *)((long)pvVar31 + uVar30 + local_220) *
                                        (int)*(char *)((long)bottom_blob_g.data +
                                                      (long)piVar13[uVar30] +
                                                      (long)bottom_blob_int8.w *
                                                      (long)iVar26 * (long)this->stride_h +
                                                      (long)(int)uVar24 * (long)this->stride_w);
                      uVar30 = uVar30 + 1;
                    } while (uVar14 != uVar30);
                  }
                  *(int *)((long)pvVar20 + uVar24 * 4) = iVar28;
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar18);
              }
              pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar18 * 4);
              bVar36 = iVar26 != iVar25;
              iVar26 = iVar26 + 1;
            } while (bVar36);
          }
          uVar10._0_1_ = opt->lightmode;
          uVar10._1_3_ = *(undefined3 *)&opt->field_0x1;
          uVar10._4_4_ = opt->num_threads;
          opt_g_1.workspace_allocator = opt->workspace_allocator;
          opt_g_1._0_4_ = SUB84(uVar10,0);
          opt_g_1.num_threads = 1;
          bottom_blob_int8_g.allocator = top_blob->allocator;
          bottom_blob_int8_g.elemsize = top_blob->elemsize;
          bottom_blob_int8_g.refcount = (int *)0x0;
          bottom_blob_int8_g.data =
               (void *)(top_blob->cstep * lVar33 * bottom_blob_int8_g.elemsize +
                       (long)top_blob->data);
          bottom_blob_int8_g.w = top_blob->w;
          bottom_blob_int8_g.dims = 3;
          bottom_blob_int8_g.h = top_blob->h;
          bottom_blob_int8_g.c = 1;
          bottom_blob_int8_g.cstep =
               ((long)(top_blob->h * top_blob->w) * bottom_blob_int8_g.elemsize + 0xf &
               0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
          pLVar5 = (this->dequantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar33];
          opt_g_1.blob_allocator = bottom_blob_int8_g.allocator;
          (*pLVar5->_vptr_Layer[7])(pLVar5,&bottom_blob_int8_g,&opt_g_1);
          if (bottom_blob_int8_g.refcount != (int *)0x0) {
            LOCK();
            *bottom_blob_int8_g.refcount = *bottom_blob_int8_g.refcount + -1;
            UNLOCK();
            if (*bottom_blob_int8_g.refcount == 0) {
              if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                if (bottom_blob_int8_g.data != (void *)0x0) {
                  free(*(void **)((long)bottom_blob_int8_g.data + -8));
                }
              }
              else {
                (**(code **)(*(long *)bottom_blob_int8_g.allocator + 8))();
              }
            }
          }
          bottom_blob_int8_g._0_16_ = ZEXT816(0);
          bottom_blob_int8_g.elemsize = 0;
          bottom_blob_int8_g.cstep = 0;
          bottom_blob_int8_g._32_16_ = ZEXT816(0);
          if (bottom_blob_g.refcount != (int *)0x0) {
            LOCK();
            *bottom_blob_g.refcount = *bottom_blob_g.refcount + -1;
            UNLOCK();
            if (*bottom_blob_g.refcount == 0) {
              if (bottom_blob_g.allocator == (Allocator *)0x0) {
                if (bottom_blob_g.data != (void *)0x0) {
                  free(*(void **)((long)bottom_blob_g.data + -8));
                }
              }
              else {
                (**(code **)(*(long *)bottom_blob_g.allocator + 8))();
              }
            }
          }
          bottom_blob_g._0_16_ = ZEXT816(0);
          bottom_blob_g.elemsize = 0;
          bottom_blob_g.cstep = 0;
          bottom_blob_g._32_16_ = ZEXT816(0);
          lVar33 = lVar33 + 1;
          local_220 = local_220 + __n;
        } while (lVar33 < this->group);
      }
      if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar15 = 0;
    }
  }
  else {
    copy_make_border((Mat *)local_d8,&bottom_blob_int8,this->pad_h,this->pad_h,iVar15,iVar15,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    iVar15 = -100;
    if ((bottom_blob_int8.data != (void *)0x0) &&
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) {
      iVar25 = bottom_blob_int8.h;
      iVar28 = bottom_blob_int8.w;
      goto LAB_00137ff6;
    }
  }
LAB_00138e29:
  if (bottom_blob_int8.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
    UNLOCK();
    if (*bottom_blob_int8.refcount == 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        if (bottom_blob_int8.data != (void *)0x0) {
          free(*(void **)((long)bottom_blob_int8.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
      }
    }
  }
  bottom_blob_int8._0_16_ = ZEXT816(0);
  bottom_blob_int8._32_16_ = ZEXT816(0);
LAB_00138e76:
  bottom_blob_int8.cstep = 0;
  bottom_blob_int8.elemsize = 0;
  if ((int *)local_d8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_d8._8_8_ == 0) {
      if ((Allocator *)local_d8._24_8_ == (Allocator *)0x0) {
        if ((void *)local_d8._0_8_ != (void *)0x0) {
          free(*(void **)(local_d8._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_d8._24_8_ + 8))();
      }
    }
  }
  return iVar15;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // depth-wise
        if (channels == group && group == num_output)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                int* outptr = top_blob.channel(g);
                const signed char* kptr = (const signed char*)weight_data + maxk * g;
                const Mat m = bottom_blob_bordered.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            signed char val = sptr[ space_ofs[k] ];
                            signed char w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(g, 1);
                    dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                }
            }
        }
        else
        {
            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

#ifdef _WIN32
            #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
            #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
            for (int g=0; g<group; g++)
            {
                for (int p=0; p<num_output_g; p++)
                {
                    int* outptr = top_blob.channel(g * num_output_g + p);
                    const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                            // channels_g
                            for (int q=0; q<channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                                for (int k = 0; k < maxk; k++)
                                {
                                    signed char val = sptr[ space_ofs[k] ];
                                    signed char w = kptr[k];
                                    sum += val * w;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = sum;
                        }

                        outptr += outw;
                    }
                }
            }

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                ncnn::Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);
                dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
            }
        }

        return 0;
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
    #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}